

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_queue.cpp
# Opt level: O0

void __thiscall Priority_queue::pop(Priority_queue *this)

{
  double dVar1;
  double dVar2;
  value_type vVar3;
  int iVar4;
  bool bVar5;
  ostream *this_00;
  reference pvVar6;
  T temp;
  int child;
  int i;
  Priority_queue *this_local;
  
  bVar5 = empty(this);
  if (bVar5) {
    this_00 = std::operator<<((ostream *)&std::cout,"This priority queue is empty!");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  else {
    iVar4 = this->currentsize;
    this->currentsize = iVar4 + -1;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&this->PriQueue,(long)iVar4);
    dVar1 = *pvVar6;
    temp._4_4_ = 1;
    while (temp._4_4_ * 2 <= this->currentsize) {
      temp._0_4_ = temp._4_4_ * 2;
      if (temp._0_4_ != this->currentsize) {
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&this->PriQueue,(long)temp._0_4_);
        dVar2 = *pvVar6;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&this->PriQueue,(long)(temp._0_4_ + 1));
        if (dVar2 < *pvVar6) {
          temp._0_4_ = temp._0_4_ + 1;
        }
      }
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&this->PriQueue,(long)temp._0_4_);
      if (*pvVar6 <= dVar1) break;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&this->PriQueue,(long)temp._0_4_);
      vVar3 = *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&this->PriQueue,(long)temp._4_4_);
      *pvVar6 = vVar3;
      temp._4_4_ = temp._0_4_;
    }
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->PriQueue,(long)temp._4_4_);
    *pvVar6 = dVar1;
  }
  return;
}

Assistant:

void Priority_queue::pop() {
    if (empty())
        cout << "This priority queue is empty!" << endl;
    else {
        int i, child; //child是i的子结点序号
        T temp = PriQueue[currentsize--]; //将最后一个位置的值储存
        for (i = 1; i * 2 <= currentsize; i = child) {
            child = i * 2;
            if (child != currentsize && PriQueue[child] < PriQueue[child + 1]) //选择大的子结点
                child++;
            if (temp < PriQueue[child]) //下虑，把空位置下移
                PriQueue[i] = PriQueue[child];
            else
                break;
        }
        PriQueue[i] = temp;
    }
}